

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_get_tile_dimensions
               (opj_image_t *l_image,opj_tcd_tilecomp_t *l_tilec,opj_image_comp_t *l_img_comp,
               OPJ_UINT32 *l_size_comp,OPJ_UINT32 *l_width,OPJ_UINT32 *l_height,
               OPJ_UINT32 *l_offset_x,OPJ_UINT32 *l_offset_y,OPJ_UINT32 *l_image_width,
               OPJ_UINT32 *l_stride,OPJ_UINT32 *l_tile_offset)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 l_remaining;
  OPJ_UINT32 *l_height_local;
  OPJ_UINT32 *l_width_local;
  OPJ_UINT32 *l_size_comp_local;
  opj_image_comp_t *l_img_comp_local;
  opj_tcd_tilecomp_t *l_tilec_local;
  opj_image_t *l_image_local;
  
  *l_size_comp = l_img_comp->prec >> 3;
  if ((l_img_comp->prec & 7) != 0) {
    *l_size_comp = *l_size_comp + 1;
  }
  if (*l_size_comp == 3) {
    *l_size_comp = 4;
  }
  *l_width = l_tilec->x1 - l_tilec->x0;
  *l_height = l_tilec->y1 - l_tilec->y0;
  OVar1 = opj_int_ceildiv(l_image->x0,l_img_comp->dx);
  *l_offset_x = OVar1;
  OVar1 = opj_int_ceildiv(l_image->y0,l_img_comp->dy);
  *l_offset_y = OVar1;
  OVar1 = opj_int_ceildiv(l_image->x1 - l_image->x0,l_img_comp->dx);
  *l_image_width = OVar1;
  *l_stride = *l_image_width - *l_width;
  *l_tile_offset = (l_tilec->x0 - *l_offset_x) + (l_tilec->y0 - *l_offset_y) * *l_image_width;
  return;
}

Assistant:

static void opj_get_tile_dimensions(opj_image_t * l_image,
                                    opj_tcd_tilecomp_t * l_tilec,
                                    opj_image_comp_t * l_img_comp,
                                    OPJ_UINT32* l_size_comp,
                                    OPJ_UINT32* l_width,
                                    OPJ_UINT32* l_height,
                                    OPJ_UINT32* l_offset_x,
                                    OPJ_UINT32* l_offset_y,
                                    OPJ_UINT32* l_image_width,
                                    OPJ_UINT32* l_stride,
                                    OPJ_UINT32* l_tile_offset)
{
    OPJ_UINT32 l_remaining;
    *l_size_comp = l_img_comp->prec >> 3; /* (/8) */
    l_remaining = l_img_comp->prec & 7;  /* (%8) */
    if (l_remaining) {
        *l_size_comp += 1;
    }

    if (*l_size_comp == 3) {
        *l_size_comp = 4;
    }

    *l_width  = (OPJ_UINT32)(l_tilec->x1 - l_tilec->x0);
    *l_height = (OPJ_UINT32)(l_tilec->y1 - l_tilec->y0);
    *l_offset_x = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)l_image->x0,
                  (OPJ_INT32)l_img_comp->dx);
    *l_offset_y = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)l_image->y0,
                  (OPJ_INT32)l_img_comp->dy);
    *l_image_width = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)l_image->x1 -
                     (OPJ_INT32)l_image->x0, (OPJ_INT32)l_img_comp->dx);
    *l_stride = *l_image_width - *l_width;
    *l_tile_offset = ((OPJ_UINT32)l_tilec->x0 - *l_offset_x) + ((
                         OPJ_UINT32)l_tilec->y0 - *l_offset_y) * *l_image_width;
}